

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gdft.c
# Opt level: O1

int gdFTUseFontConfig(int flag)

{
  return 0;
}

Assistant:

BGD_DECLARE(int) gdFTUseFontConfig(int flag)
{
#ifdef HAVE_LIBFONTCONFIG
	fontConfigFlag = flag;
	return 1;
#else
	(void)flag;
	return 0;
#endif /* HAVE_LIBFONTCONFIG */
}